

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O3

int32 accum_mmie_dump(char *out_dir,char *lat_ext,model_inventory_t *inv,int32 mean_reest,
                     int32 var_reest)

{
  gauden_t *pgVar1;
  int iVar2;
  int32 iVar3;
  vector_t ***wt_var;
  vector_t ***wt_mean;
  char fn [4097];
  
  pgVar1 = inv->gauden;
  mk_bkp(0,0,mean_reest,var_reest,out_dir);
  if (var_reest == 0 && mean_reest == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
            ,0x44d,"means and variances not reestimated.  No %s/%s_gauden_counts produced.\n",
            out_dir,lat_ext);
  }
  else {
    wt_mean = (vector_t ***)0x0;
    sprintf(fn,"%s/%s_gauden_counts",out_dir);
    if (mean_reest != 0) {
      wt_mean = pgVar1->macc;
    }
    if (var_reest == 0) {
      wt_var = (vector_t ***)0x0;
    }
    else {
      wt_var = pgVar1->vacc;
    }
    iVar2 = s3gaucnt_write(fn,wt_mean,wt_var,0,pgVar1->dnom,pgVar1->n_mgau,pgVar1->n_feat,
                           pgVar1->n_density,pgVar1->veclen);
    if (iVar2 != 0) {
      revert_bkp(0,0,mean_reest,var_reest,out_dir);
      return -1;
    }
  }
  iVar3 = commit(0,0,mean_reest,var_reest,0,out_dir);
  return iVar3;
}

Assistant:

int32
accum_mmie_dump(const char *out_dir,
		const char *lat_ext,
		model_inventory_t *inv,
		int32 mean_reest,
		int32 var_reest)      /* checkpoint dump flag */
{
  char fn[MAXPATHLEN+1];
  gauden_t *g;
  
  /* run over the accumulators and report anything exceptional */
  accum_stat(inv, FALSE);
  
  g = inv->gauden;
  
  mk_bkp(FALSE, FALSE, mean_reest, var_reest, out_dir);
  
  if (mean_reest || var_reest) {
    int32 rv;
    
    sprintf(fn, "%s/%s_gauden_counts", out_dir, lat_ext);
    
    rv = s3gaucnt_write(fn,
			(mean_reest ? g->macc : NULL),
			(var_reest ? g->vacc : NULL),
			FALSE,
			g->dnom,
			g->n_mgau,
			g->n_feat,
			g->n_density,
			g->veclen);
    if (rv != S3_SUCCESS) {
      revert_bkp(FALSE,
		 FALSE,
		 mean_reest,
		 var_reest,
		 out_dir);
      
      return S3_ERROR;
    }
  }
  else {
    E_INFO("means and variances not reestimated.  "
	   "No %s/%s_gauden_counts produced.\n",
	   out_dir, lat_ext);
  }
  
  return commit(FALSE,
		FALSE,
		mean_reest,
		var_reest,
		FALSE,
		out_dir);
}